

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_epoll_ctl(int event_fd)

{
  uint __epfd;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  void *pvVar7;
  ulong unaff_RBX;
  undefined1 *puVar8;
  epoll_event event;
  char buf [512];
  int iStack_24e0;
  uint uStack_24dc;
  ulong uStack_24d8;
  undefined1 auStack_24d0 [512];
  stat sStack_22d0;
  char acStack_2240 [4096];
  char acStack_1240 [4096];
  ulong uStack_240;
  epoll_event local_224 [33];
  
  local_224[0].events = 1;
  local_224[0]._4_4_ = event_fd;
  __epfd = epoll_create1(0);
  if (__epfd == 0xffffffff) {
    vfio_epoll_ctl_cold_2();
  }
  else {
    unaff_RBX = (ulong)__epfd;
    iVar1 = epoll_ctl(__epfd,1,event_fd,local_224);
    if (iVar1 != -1) {
      return __epfd;
    }
  }
  puVar8 = (undefined1 *)((long)&local_224[0].data + 4);
  vfio_epoll_ctl_cold_1();
  uStack_240 = unaff_RBX;
  snprintf(acStack_1240,0x1000,"/sys/bus/pci/devices/%s/",puVar8);
  iVar1 = stat(acStack_1240,&sStack_22d0);
  if (iVar1 < 0) {
    return -1;
  }
  sVar4 = strlen(acStack_1240);
  strncat(acStack_1240,"iommu_group",0xfff - sVar4);
  sVar5 = readlink(acStack_1240,acStack_2240,0x1000);
  if (sVar5 == -1) {
    vfio_init_cold_11();
LAB_00107782:
    vfio_init_cold_10();
LAB_0010778c:
    vfio_init_cold_8();
LAB_00107796:
    vfio_init_cold_7();
LAB_001077a0:
    vfio_init_cold_6();
LAB_001077aa:
    vfio_init_cold_5();
LAB_001077b4:
    vfio_init_cold_3();
LAB_001077be:
    vfio_init_cold_9();
LAB_001077c8:
    vfio_init_cold_1();
LAB_001077d2:
    vfio_init_cold_2();
  }
  else {
    acStack_2240[(int)sVar5] = '\0';
    pcVar6 = __xpg_basename(acStack_2240);
    iVar1 = __isoc99_sscanf(pcVar6,"%d",&uStack_24dc);
    if (iVar1 == -1) goto LAB_00107782;
    iVar1 = get_vfio_container();
    iStack_24e0 = iVar1;
    if (iVar1 == -1) {
      iVar2 = open("/dev/vfio/vfio",2);
      if (iVar2 == -1) goto LAB_001077be;
      iStack_24e0 = iVar2;
      set_vfio_container(iVar2);
      iVar3 = ioctl(iVar2,0x3b64);
      if (iVar3 != 0) goto LAB_001077c8;
      iVar2 = ioctl(iVar2,0x3b65,1);
      if (iVar2 == 1) goto LAB_0010769b;
      goto LAB_001077d2;
    }
LAB_0010769b:
    snprintf(acStack_1240,0x1000,"/dev/vfio/%d",(ulong)uStack_24dc);
    iVar2 = open(acStack_1240,2);
    if (iVar2 == -1) goto LAB_0010778c;
    uStack_24d8 = 8;
    iVar3 = ioctl(iVar2,0x3b67);
    if (iVar3 == -1) goto LAB_00107796;
    if ((uStack_24d8 & 0x100000000) == 0) goto LAB_001077a0;
    iVar3 = ioctl(iVar2,0x3b68,&iStack_24e0);
    if (iVar3 == -1) goto LAB_001077aa;
    if ((iVar1 != -1) || (iVar1 = ioctl(iStack_24e0,0x3b66,1), iVar1 != -1)) {
      iVar1 = ioctl(iVar2,0x3b6a,puVar8);
      if (iVar1 != -1) {
        vfio_enable_dma(iVar1);
        return iVar1;
      }
      goto LAB_001077b4;
    }
  }
  iVar1 = (int)auStack_24d0;
  vfio_init_cold_4();
  iVar2 = ioctl(iVar1,0x3b6c);
  if (iVar2 != -1) {
    pvVar7 = mmap((void *)0x0,0,3,1,iVar1,0);
    if (pvVar7 != (void *)0xffffffffffffffff) goto LAB_0010784b;
    vfio_map_region_cold_1();
  }
  pvVar7 = (void *)0xffffffffffffffff;
LAB_0010784b:
  return (int)pvVar7;
}

Assistant:

int vfio_epoll_ctl(int event_fd) {
	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = event_fd;

	int epoll_fd = (int) check_err(epoll_create1(0), "to created epoll");

	check_err(epoll_ctl(epoll_fd, EPOLL_CTL_ADD, event_fd, &event), "to initialize epoll");

	return epoll_fd;
}